

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_multisample_target.c
# Opt level: O0

void bitmap_move(void)

{
  float fVar1;
  double dVar2;
  double dVar3;
  float s;
  float a;
  int i;
  int local_4;
  
  example.bitmap_t = example.bitmap_t + 1.0;
  for (local_4 = 0; local_4 < 8; local_4 = local_4 + 1) {
    fVar1 = ((float)local_4 * 6.2831855) / 16.0;
    dVar2 = sin((double)((example.bitmap_t + (float)(local_4 * 0x28)) / 180.0) * 3.141592653589793);
    dVar3 = cos((double)fVar1);
    example.bitmap_x[local_4] = (float)((double)((float)dVar2 * 90.0) * dVar3 + 100.0);
    dVar3 = sin((double)fVar1);
    example.bitmap_y[local_4] = (float)((double)((float)dVar2 * 90.0) * dVar3 + 100.0);
  }
  return;
}

Assistant:

static void bitmap_move(void)
{
   int i;

   example.bitmap_t++;
   for (i = 0; i < 8; i++) {
      float a = 2 * ALLEGRO_PI * i / 16;
      float s = sin((example.bitmap_t + i * 40) / 180 * ALLEGRO_PI);
      s *= 90;
      example.bitmap_x[i] = 100 + s * cos(a);
      example.bitmap_y[i] = 100 + s * sin(a);
   }
}